

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_char>(SrcBuffer *this,char *Ptr)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  size_t sVar5;
  pointer pMVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  ulong uVar9;
  difference_type dVar10;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  uchar *local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  EOL;
  uchar PtrOffset;
  ptrdiff_t PtrDiff;
  char *BufStart;
  size_t local_40;
  size_t N;
  StringRef S;
  size_t Sz;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *Offsets;
  char *Ptr_local;
  SrcBuffer *this_local;
  
  Sz = 0;
  Offsets = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)Ptr;
  Ptr_local = (char *)this;
  bVar1 = PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
          ::isNull(&this->OffsetCache);
  if (bVar1) {
    pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x18);
    memset(pvVar4,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(pvVar4);
    Sz = (size_t)pvVar4;
    PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    ::operator=(&this->OffsetCache,(vector<unsigned_char,_std::allocator<unsigned_char>_> **)&Sz);
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    sVar5 = MemoryBuffer::getBufferSize(pMVar6);
    S.Length = sVar5;
    bVar3 = std::numeric_limits<unsigned_char>::max();
    if (bVar3 < sVar5) {
      __assert_fail("Sz <= std::numeric_limits<T>::max()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0x51,
                    "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                   );
    }
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    _N = MemoryBuffer::getBuffer(pMVar6);
    for (local_40 = 0; local_40 < S.Length; local_40 = local_40 + 1) {
      cVar2 = StringRef::operator[]((StringRef *)&N,local_40);
      if (cVar2 == '\n') {
        BufStart._7_1_ = (undefined1)local_40;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)Sz,
                   (value_type_conflict *)((long)&BufStart + 7));
      }
    }
  }
  else {
    Sz = (size_t)PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                 ::get<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
                           ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                             *)&this->OffsetCache);
  }
  pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator->
                     (&this->Buffer);
  pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           MemoryBuffer::getBufferStart(pMVar6);
  pvVar4 = Offsets;
  bVar1 = false;
  if (pvVar7 <= Offsets) {
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             MemoryBuffer::getBufferEnd(pMVar6);
    bVar1 = pvVar4 <= pvVar8;
  }
  if (bVar1) {
    uVar9 = (long)Offsets - (long)pvVar7;
    bVar1 = false;
    if (-1 < (long)uVar9) {
      bVar3 = std::numeric_limits<unsigned_char>::max();
      bVar1 = uVar9 <= bVar3;
    }
    if (bVar1) {
      EOL._M_current._7_1_ = (undefined1)uVar9;
      local_70._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)Sz);
      local_78 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)Sz);
      local_68 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                           (local_70,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )local_78,(uchar *)((long)&EOL._M_current + 7));
      local_80._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)Sz);
      dVar10 = __gnu_cxx::operator-(&local_68,&local_80);
      return (int)dVar10 + 1;
    }
    __assert_fail("PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                  ,0x5f,
                  "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                 );
  }
  __assert_fail("Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                ,0x5d,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // std::lower_bound returns the first EOL offset that's not-less-than
  // PtrOffset, meaning the EOL that _ends the line_ that PtrOffset is on
  // (including if PtrOffset refers to the EOL itself). If there's no such
  // EOL, returns end().
  auto EOL = std::lower_bound(Offsets->begin(), Offsets->end(), PtrOffset);

  // Lines count from 1, so add 1 to the distance from the 0th line.
  return (1 + (EOL - Offsets->begin()));
}